

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.cc
# Opt level: O0

bool __thiscall flow::diagnostics::Message::operator==(Message *this,Message *other)

{
  bool bVar1;
  __type_conflict2 local_19;
  Message *other_local;
  Message *this_local;
  
  local_19 = false;
  if (this->type == other->type) {
    bVar1 = FilePos::operator==(&(this->sourceLocation).begin,&(other->sourceLocation).begin);
    local_19 = false;
    if (bVar1) {
      local_19 = std::operator==(&this->text,&other->text);
    }
  }
  return local_19;
}

Assistant:

bool Message::operator==(const Message& other) const noexcept {
  // XXX ignore SourceLocation's filename & end
  return type == other.type &&
         sourceLocation.begin == other.sourceLocation.begin &&
         text == other.text;
}